

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodetxb.c
# Opt level: O0

void av1_record_txb_context
               (int plane,int block,int blk_row,int blk_col,BLOCK_SIZE plane_bsize,TX_SIZE tx_size,
               void *arg)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  uint uVar7;
  long lVar8;
  void *__src;
  SCAN_ORDER *pSVar9;
  long lVar10;
  int *__dest;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  undefined4 in_R8D;
  byte in_R9B;
  long *in_stack_00000008;
  uint8_t cul_level;
  int dc_sign_ctx;
  tran_low_t level;
  tran_low_t v;
  int pos;
  int c;
  int16_t *scan;
  _Bool do_coeff_scan;
  tran_low_t *tcoeff_txb;
  int seg_eob;
  int segment_id;
  uint8_t *entropy_ctx;
  uint16_t *eob_txb;
  int txb_offset;
  CB_COEFF_BUFFER *cb_coef_buff;
  TXB_CTX txb_ctx;
  MB_MODE_INFO *mbmi;
  tran_low_t *tcoeff;
  SCAN_ORDER *scan_order;
  TX_TYPE tx_type;
  PLANE_TYPE plane_type;
  tran_low_t *qcoeff;
  int block_offset;
  int eob;
  macroblockd_plane *pd;
  macroblock_plane *p;
  MACROBLOCKD *xd;
  MACROBLOCK *x;
  ThreadData_conflict *td;
  AV1_COMMON *cm;
  AV1_COMP *cpi;
  tokenize_b_args *args;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff04;
  TX_SIZE in_stack_ffffffffffffff06;
  BLOCK_SIZE in_stack_ffffffffffffff07;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff20;
  undefined2 uVar11;
  int in_stack_ffffffffffffff24;
  int in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  MACROBLOCKD *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff48;
  undefined1 local_90;
  int local_8c;
  
  lVar3 = *in_stack_00000008;
  lVar4 = in_stack_00000008[1];
  lVar8 = lVar4 + (long)in_EDI * 0x88;
  uVar2 = *(ushort *)(*(long *)(lVar8 + 0x20) + (long)in_ESI * 2);
  __src = (void *)(*(long *)(lVar8 + 0x10) + (long)(in_ESI << 4) * 4);
  bVar1 = *(byte *)(lVar4 + 0x1b0 + (long)in_EDI * 0xa30);
  bVar6 = av1_get_tx_type((MACROBLOCKD *)
                          CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                          (PLANE_TYPE)((uint)in_ESI >> 0x18),in_EDX,in_ECX,
                          (TX_SIZE)((uint)in_R8D >> 0x18),
                          CONCAT13(in_stack_ffffffffffffff07,
                                   CONCAT12(in_stack_ffffffffffffff06,in_stack_ffffffffffffff04)));
  pSVar9 = get_scan('\0','\0');
  uVar11 = (undefined2)((uint)in_stack_ffffffffffffff20 >> 0x10);
  if (*(char *)((long)in_stack_00000008 + 0x15) == '\0') {
    get_txb_ctx(in_stack_ffffffffffffff07,in_stack_ffffffffffffff06,in_stack_ffffffffffffff00,
                (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                (ENTROPY_CONTEXT *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (TXB_CTX *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    lVar8 = *(long *)(lVar4 + 0x4190);
    uVar7 = *(ushort *)(*(long *)(lVar4 + 0x4178) + 0x4e + (ulong)bVar1 * 2) / 0x10;
    lVar5 = *(long *)(lVar8 + 0x18 + (long)in_EDI * 8);
    lVar10 = *(long *)(lVar8 + 0x30 + (long)in_EDI * 8) + (long)(int)uVar7;
    *(undefined1 *)(lVar10 + in_ESI) = local_90;
    *(ushort *)(lVar5 + (long)(int)uVar7 * 2 + (long)in_ESI * 2) = uVar2;
    if (uVar2 == 0) {
      av1_set_entropy_contexts
                (in_stack_ffffffffffffff30,
                 (macroblockd_plane *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                 in_stack_ffffffffffffff24,(BLOCK_SIZE)((uint)in_stack_ffffffffffffff20 >> 0x18),
                 (TX_SIZE)((uint)in_stack_ffffffffffffff20 >> 0x10),in_stack_ffffffffffffff1c,
                 in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
      return;
    }
    in_stack_ffffffffffffff48 =
         av1_get_tx_eob((segmentation *)
                        CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                        in_stack_fffffffffffffeec,(TX_SIZE)((uint)in_stack_fffffffffffffee8 >> 0x18)
                       );
    lVar8 = *(long *)(lVar8 + (long)in_EDI * 8) +
            (long)(int)(uint)*(ushort *)(*(long *)(lVar4 + 0x4178) + 0x4e + (ulong)bVar1 * 2) * 4;
    __dest = (int *)(lVar8 + (long)(in_ESI << 4) * 4);
    memcpy(__dest,__src,(long)in_stack_ffffffffffffff48 << 2);
    in_stack_ffffffffffffff40 = (int)lVar8;
    bVar1 = *(byte *)(lVar3 + 0x9ae91);
    in_stack_ffffffffffffff30 = (MACROBLOCKD *)pSVar9->scan;
    lVar8 = lVar4 + 0x256c8 + (ulong)in_R9B * 0x40;
    *(int *)(lVar8 + (ulong)bVar6 * 4) = *(int *)(lVar8 + (ulong)bVar6 * 4) + 1;
    in_stack_ffffffffffffff2c = (uint)uVar2;
    while( true ) {
      uVar11 = (undefined2)((uint)in_stack_ffffffffffffff20 >> 0x10);
      in_stack_ffffffffffffff2c = in_stack_ffffffffffffff2c - 1;
      bVar6 = 0;
      if (-1 < (int)in_stack_ffffffffffffff2c) {
        bVar6 = bVar1 & 1;
      }
      if (bVar6 == 0) break;
      in_stack_ffffffffffffff28 =
           (int)*(short *)((long)(in_stack_ffffffffffffff30->plane[0].pre + -2) +
                          (long)(int)in_stack_ffffffffffffff2c * 2);
      in_stack_ffffffffffffff24 = *(int *)((long)__src + (long)in_stack_ffffffffffffff28 * 4);
      in_stack_ffffffffffffff20 = in_stack_ffffffffffffff24;
      if (in_stack_ffffffffffffff24 < 1) {
        in_stack_ffffffffffffff20 = -in_stack_ffffffffffffff24;
      }
      if ((*(byte *)(lVar3 + 0x9ae91) & 1) != 0) {
        *(long *)(lVar4 + 0x25d30) = (long)in_stack_ffffffffffffff20 + *(long *)(lVar4 + 0x25d30);
      }
    }
    if (*__dest != 0) {
      *(byte *)(lVar10 + in_ESI) = *(byte *)(lVar10 + in_ESI) | (byte)(local_8c << 4);
      in_stack_ffffffffffffff1c = local_8c;
    }
    in_stack_ffffffffffffff07 = BLOCK_4X4;
  }
  av1_get_txb_entropy_context
            ((tran_low_t *)CONCAT44(in_ECX,in_R8D),
             (SCAN_ORDER *)
             CONCAT17(in_stack_ffffffffffffff07,
                      CONCAT16(in_stack_ffffffffffffff06,
                               CONCAT24(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00))),
             in_stack_fffffffffffffefc);
  av1_set_entropy_contexts
            (in_stack_ffffffffffffff30,
             (macroblockd_plane *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
             in_stack_ffffffffffffff24,(BLOCK_SIZE)((ushort)uVar11 >> 8),(TX_SIZE)uVar11,
             in_stack_ffffffffffffff1c,in_stack_ffffffffffffff40,in_stack_ffffffffffffff48);
  return;
}

Assistant:

void av1_record_txb_context(int plane, int block, int blk_row, int blk_col,
                            BLOCK_SIZE plane_bsize, TX_SIZE tx_size,
                            void *arg) {
  struct tokenize_b_args *const args = arg;
  const AV1_COMP *cpi = args->cpi;
  const AV1_COMMON *cm = &cpi->common;
  ThreadData *const td = args->td;
  MACROBLOCK *const x = &td->mb;
  MACROBLOCKD *const xd = &x->e_mbd;
  struct macroblock_plane *p = &x->plane[plane];
  struct macroblockd_plane *pd = &xd->plane[plane];
  const int eob = p->eobs[block];
  const int block_offset = BLOCK_OFFSET(block);
  tran_low_t *qcoeff = p->qcoeff + block_offset;
  const PLANE_TYPE plane_type = pd->plane_type;
  const TX_TYPE tx_type =
      av1_get_tx_type(xd, plane_type, blk_row, blk_col, tx_size,
                      cm->features.reduced_tx_set_used);
  const SCAN_ORDER *const scan_order = get_scan(tx_size, tx_type);
  tran_low_t *tcoeff;
  assert(args->dry_run != DRY_RUN_COSTCOEFFS);
  if (args->dry_run == OUTPUT_ENABLED) {
    MB_MODE_INFO *mbmi = xd->mi[0];
    TXB_CTX txb_ctx;
    get_txb_ctx(plane_bsize, tx_size, plane,
                pd->above_entropy_context + blk_col,
                pd->left_entropy_context + blk_row, &txb_ctx);
#if CONFIG_ENTROPY_STATS
    const TX_SIZE txsize_ctx = get_txsize_entropy_ctx(tx_size);
    const int bhl = get_txb_bhl(tx_size);
    const int width = get_txb_wide(tx_size);
    const int height = get_txb_high(tx_size);
    int cdf_idx = cm->coef_cdf_category;
    ++td->counts->txb_skip[cdf_idx][txsize_ctx][txb_ctx.txb_skip_ctx][eob == 0];
#endif  // CONFIG_ENTROPY_STATS

    CB_COEFF_BUFFER *cb_coef_buff = x->cb_coef_buff;
    const int txb_offset = x->mbmi_ext_frame->cb_offset[plane_type] /
                           (TX_SIZE_W_MIN * TX_SIZE_H_MIN);
    uint16_t *eob_txb = cb_coef_buff->eobs[plane] + txb_offset;
    uint8_t *const entropy_ctx = cb_coef_buff->entropy_ctx[plane] + txb_offset;
    entropy_ctx[block] = txb_ctx.txb_skip_ctx;
    eob_txb[block] = eob;

    if (eob == 0) {
      av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, 0, blk_col,
                               blk_row);
      return;
    }
    const int segment_id = mbmi->segment_id;
    const int seg_eob = av1_get_tx_eob(&cpi->common.seg, segment_id, tx_size);
    tran_low_t *tcoeff_txb =
        cb_coef_buff->tcoeff[plane] + x->mbmi_ext_frame->cb_offset[plane_type];
    tcoeff = tcoeff_txb + block_offset;
    memcpy(tcoeff, qcoeff, sizeof(*tcoeff) * seg_eob);

#if CONFIG_ENTROPY_STATS
    uint8_t levels_buf[TX_PAD_2D];
    uint8_t *const levels = set_levels(levels_buf, height);
    av1_txb_init_levels(tcoeff, width, height, levels);
    update_tx_type_count(cpi, cm, xd, blk_row, blk_col, plane, tx_size,
                         td->counts, 0 /*allow_update_cdf*/);

    const TX_CLASS tx_class = tx_type_to_class[tx_type];
    const bool do_coeff_scan = true;
#else
    const bool do_coeff_scan = cpi->mt_info.pack_bs_mt_enabled;
#endif
    const int16_t *const scan = scan_order->scan;

    // record tx type usage
    td->rd_counts.tx_type_used[tx_size][tx_type]++;

#if CONFIG_ENTROPY_STATS
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    update_eob_context(cdf_idx, eob, tx_size, tx_class, plane_type, ec_ctx,
                       td->counts, 0 /*allow_update_cdf*/);

    DECLARE_ALIGNED(16, int8_t, coeff_contexts[MAX_TX_SQUARE]);
    av1_get_nz_map_contexts(levels, scan, eob, tx_size, tx_class,
                            coeff_contexts);
#endif

    for (int c = eob - 1; (c >= 0) && do_coeff_scan; --c) {
      const int pos = scan[c];
      const tran_low_t v = qcoeff[pos];
      const tran_low_t level = abs(v);
      /* abs_sum_level is needed to decide the job scheduling order of
       * pack bitstream multi-threading. This data is not needed if
       * multi-threading is disabled. */
      if (cpi->mt_info.pack_bs_mt_enabled) td->abs_sum_level += level;

#if CONFIG_ENTROPY_STATS
      const int coeff_ctx = coeff_contexts[pos];
      if (c == eob - 1) {
        assert(coeff_ctx < 4);
        ++td->counts->coeff_base_eob_multi[cdf_idx][txsize_ctx][plane_type]
                                          [coeff_ctx][AOMMIN(level, 3) - 1];
      } else {
        ++td->counts->coeff_base_multi[cdf_idx][txsize_ctx][plane_type]
                                      [coeff_ctx][AOMMIN(level, 3)];
      }
      if (level > NUM_BASE_LEVELS) {
        const int base_range = level - 1 - NUM_BASE_LEVELS;
        const int br_ctx = get_br_ctx(levels, pos, bhl, tx_class);
        for (int idx = 0; idx < COEFF_BASE_RANGE; idx += BR_CDF_SIZE - 1) {
          const int k = AOMMIN(base_range - idx, BR_CDF_SIZE - 1);
          for (int lps = 0; lps < BR_CDF_SIZE - 1; lps++) {
            ++td->counts->coeff_lps[AOMMIN(txsize_ctx, TX_32X32)][plane_type]
                                   [lps][br_ctx][lps == k];
            if (lps == k) break;
          }
          ++td->counts->coeff_lps_multi[cdf_idx][AOMMIN(txsize_ctx, TX_32X32)]
                                       [plane_type][br_ctx][k];
          if (k < BR_CDF_SIZE - 1) break;
        }
      }
#endif
    }
    // Update the context needed to code the DC sign (if applicable)
    if (tcoeff[0] != 0) {
      const int dc_sign_ctx = txb_ctx.dc_sign_ctx;
#if CONFIG_ENTROPY_STATS
      const int dc_sign = (tcoeff[0] < 0) ? 1 : 0;
      ++td->counts->dc_sign[plane_type][dc_sign_ctx][dc_sign];
#endif  // CONFIG_ENTROPY_STATS
      entropy_ctx[block] |= dc_sign_ctx << DC_SIGN_CTX_SHIFT;
    }
  } else {
    tcoeff = qcoeff;
  }
  const uint8_t cul_level =
      av1_get_txb_entropy_context(tcoeff, scan_order, eob);
  av1_set_entropy_contexts(xd, pd, plane, plane_bsize, tx_size, cul_level,
                           blk_col, blk_row);
}